

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

AWeapon * __thiscall FWeaponSlots::PickNextWeapon(FWeaponSlots *this,player_t *player)

{
  bool bVar1;
  int iVar2;
  PClassWeapon *type_00;
  AWeapon *this_00;
  AWeapon *weap;
  PClassWeapon *type;
  int local_30;
  int index;
  int slot;
  int slotschecked;
  int startindex;
  int startslot;
  player_t *player_local;
  FWeaponSlots *this_local;
  
  index = 0;
  if (player->mo == (APlayerPawn *)0x0) {
    this_local = (FWeaponSlots *)0x0;
  }
  else {
    _startindex = player;
    player_local = (player_t *)this;
    if ((player->ReadyWeapon == (AWeapon *)0x0) ||
       (bVar1 = FindMostRecentWeapon(player,&slotschecked,&slot), bVar1)) {
      if (_startindex->ReadyWeapon == (AWeapon *)0x0) {
        slotschecked = 9;
        iVar2 = FWeaponSlot::Size(this->Slots + 9);
        slot = iVar2 + -1;
      }
      local_30 = slotschecked;
      type._4_4_ = slot;
      do {
        type._4_4_ = type._4_4_ + 1;
        iVar2 = FWeaponSlot::Size(this->Slots + local_30);
        if (iVar2 <= type._4_4_) {
          type._4_4_ = 0;
          index = index + 1;
          local_30 = local_30 + 1;
          if (9 < local_30) {
            local_30 = 0;
          }
        }
        type_00 = FWeaponSlot::GetWeapon(this->Slots + local_30,type._4_4_);
        this_00 = (AWeapon *)
                  AActor::FindInventory(&_startindex->mo->super_AActor,(PClassActor *)type_00,false)
        ;
        if ((this_00 != (AWeapon *)0x0) &&
           (bVar1 = AWeapon::CheckAmmo(this_00,2,false,false,-1), bVar1)) {
          return this_00;
        }
        if ((local_30 != slotschecked) || (bVar1 = false, type._4_4_ != slot)) {
          bVar1 = index < 0xb;
        }
      } while (bVar1);
    }
    this_local = (FWeaponSlots *)_startindex->ReadyWeapon;
  }
  return (AWeapon *)this_local;
}

Assistant:

AWeapon *FWeaponSlots::PickNextWeapon(player_t *player)
{
	int startslot, startindex;
	int slotschecked = 0;

	if (player->mo == NULL)
	{
		return NULL;
	}
	if (player->ReadyWeapon == NULL || FindMostRecentWeapon(player, &startslot, &startindex))
	{
		int slot;
		int index;

		if (player->ReadyWeapon == NULL)
		{
			startslot = NUM_WEAPON_SLOTS - 1;
			startindex = Slots[startslot].Size() - 1;
		}

		slot = startslot;
		index = startindex;
		do
		{
			if (++index >= Slots[slot].Size())
			{
				index = 0;
				slotschecked++;
				if (++slot >= NUM_WEAPON_SLOTS)
				{
					slot = 0;
				}
			}
			PClassWeapon *type = Slots[slot].GetWeapon(index);
			AWeapon *weap = static_cast<AWeapon *>(player->mo->FindInventory(type));
			if (weap != NULL && weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
		while ((slot != startslot || index != startindex) && slotschecked <= NUM_WEAPON_SLOTS);
	}
	return player->ReadyWeapon;
}